

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

size_t __thiscall cppforth::Forth::RestoreInput(Forth *this)

{
  size_type sVar1;
  reference save_00;
  structSavedInput *save;
  size_type size;
  Forth *this_local;
  
  sVar1 = std::
          vector<cppforth::Forth::structSavedInput,_std::allocator<cppforth::Forth::structSavedInput>_>
          ::size(&this->savedInput);
  if (sVar1 != 0) {
    save_00 = std::
              vector<cppforth::Forth::structSavedInput,_std::allocator<cppforth::Forth::structSavedInput>_>
              ::at(&this->savedInput,sVar1 - 1);
    restoreInput(this,save_00,true,true);
    std::
    vector<cppforth::Forth::structSavedInput,_std::allocator<cppforth::Forth::structSavedInput>_>::
    pop_back(&this->savedInput);
  }
  sVar1 = std::
          vector<cppforth::Forth::structSavedInput,_std::allocator<cppforth::Forth::structSavedInput>_>
          ::size(&this->savedInput);
  return sVar1;
}

Assistant:

size_t RestoreInput(){
			auto size = savedInput.size();
			if (size > 0){
				struct structSavedInput &save{ savedInput.at(size-1)};
				restoreInput(save,true,true);
				savedInput.pop_back();
			}
			return savedInput.size();
		}